

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,
                         TestEnum_9c8e9318b29d9cd3 *param_3,undefined8 param_4,String *param_5)

{
  String *params;
  TestEnum_9c8e9318b29d9cd3 *value;
  String local_50;
  String local_38;
  undefined8 *local_20;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3_&,_capnp::schemas::TestEnum_9c8e9318b29d9cd3_&>
  *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<capnp::schemas::TestEnum_9c8e9318b29d9cd3,kj::String>
            (&local_38,(_ *)*param_2,param_3);
  params = (String *)(local_20 + 2);
  tryToCharSequence<capnp::schemas::TestEnum_9c8e9318b29d9cd3,kj::String>
            (&local_50,(_ *)local_20[1],value);
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_38,params,(StringPtr *)&local_50,param_5);
  String::~String(&local_50);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}